

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f,uint32_t bits)

{
  FILE *__stream;
  uint uVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: function=%08X bits=%08X\n",myTimeStamp::buf,"gpioSetGetSamplesFunc",
            (ulong)f & 0xffffffff,bits);
  }
  if (libInitialised == '\0') {
    uVar1 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioSetGetSamplesFunc_cold_1();
    }
  }
  else {
    gpioGetSamples_1 = 0;
    gpioGetSamples_2 = 0;
    uVar1 = 0;
    gpioGetSamples_3 = bits;
    if (f == (gpioGetSamplesFunc_t)0x0) {
      gpioGetSamples_3 = uVar1;
    }
    monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples_3;
    gpioGetSamples_0 = f;
  }
  return uVar1;
}

Assistant:

int gpioSetGetSamplesFunc(gpioGetSamplesFunc_t f, uint32_t bits)
{
   DBG(DBG_USER, "function=%08X bits=%08X", (uint32_t)f, bits);

   CHECK_INITED;

   gpioGetSamples.ex       = 0;
   gpioGetSamples.userdata = NULL;
   gpioGetSamples.func     = f;

   if (f) gpioGetSamples.bits = bits;
   else   gpioGetSamples.bits = 0;

   monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;

   return 0;
}